

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O3

bool BlockStream_Read(TBlockStream *pStream,ULONGLONG *pByteOffset,void *pvBuffer,
                     DWORD dwBytesToRead)

{
  ULONGLONG *pUVar1;
  ulong uVar2;
  uint uVar3;
  BLOCK_READ p_Var4;
  BLOCK_CHECK p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  LPBYTE __ptr;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong __n;
  DWORD dwErrCode;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  LPBYTE local_78;
  ulong local_70;
  
  p_Var4 = (pStream->super_TFileStream).BlockRead;
  if (p_Var4 == (BLOCK_READ)0x0) {
    __assert_fail("pStream->BlockRead != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x34f,"bool BlockStream_Read(TBlockStream *, ULONGLONG *, void *, DWORD)");
  }
  if (dwBytesToRead == 0) {
    return true;
  }
  pUVar1 = &(pStream->super_TFileStream).StreamPos;
  if (pByteOffset == (ULONGLONG *)0x0) {
    pByteOffset = pUVar1;
  }
  uVar15 = *pByteOffset;
  __n = (ulong)dwBytesToRead;
  uVar2 = __n + uVar15;
  if ((pStream->super_TFileStream).StreamSize < uVar2) {
    dwErrCode = 0x3ea;
LAB_0010d8ae:
    SetLastError(dwErrCode);
    return false;
  }
  uVar3 = pStream->BlockSize;
  uVar10 = (ulong)uVar3;
  if ((uVar3 & uVar3 - 1) != 0) {
    __assert_fail("(BlockSize & (BlockSize - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x364,"bool BlockStream_Read(TBlockStream *, ULONGLONG *, void *, DWORD)");
  }
  uVar14 = -uVar10 & uVar15;
  local_70 = uVar2 - uVar14;
  __ptr = (LPBYTE)malloc((ulong)((int)((local_70 + (uVar3 - 1)) / uVar10) * uVar3));
  if (__ptr == (LPBYTE)0x0) {
    dwErrCode = 0xc;
    goto LAB_0010d8ae;
  }
  uVar11 = uVar3 - 1 & (uint)uVar15;
  if (pStream->IsComplete == 0) {
    p_Var5 = (pStream->super_TFileStream).BlockCheck;
    if (p_Var5 == (BLOCK_CHECK)0x0) {
      __assert_fail("pStream->BlockCheck != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                    ,0x374,"bool BlockStream_Read(TBlockStream *, ULONGLONG *, void *, DWORD)");
    }
    bVar6 = (*p_Var5)(&pStream->super_TFileStream,uVar14);
    if (uVar14 < uVar2) {
      iVar12 = -(int)uVar14;
      bVar8 = false;
      uVar15 = uVar14;
      local_78 = __ptr;
      do {
        bVar7 = (*(pStream->super_TFileStream).BlockCheck)(&pStream->super_TFileStream,uVar15);
        if (bVar7 != bVar6) {
          iVar13 = (int)uVar14;
          if ((((pStream->super_TFileStream).pMaster != (TFileStream *)0x0) &&
              (pStream->pfnCallback != (STREAM_DOWNLOAD_CALLBACK)0x0)) && (bVar6 == false)) {
            (*pStream->pfnCallback)(pStream->UserData,uVar14,(int)uVar15 - iVar13);
            bVar8 = true;
          }
          if (uVar15 <= uVar14) {
            __assert_fail("BlockOffset > BlockOffset0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                          ,0x388,"bool BlockStream_Read(TBlockStream *, ULONGLONG *, void *, DWORD)"
                         );
          }
          bVar9 = (*(pStream->super_TFileStream).BlockRead)
                            (&pStream->super_TFileStream,uVar14,uVar15,local_78,(DWORD)local_70,
                             bVar6);
          if (!bVar9) {
            bVar7 = false;
            goto LAB_0010da22;
          }
          local_78 = local_78 + (uint)((int)uVar15 - iVar13);
          local_70 = (ulong)((DWORD)local_70 + iVar13 + iVar12);
          uVar14 = uVar15;
          bVar6 = bVar7;
        }
        uVar15 = uVar15 + uVar10;
        iVar12 = iVar12 - uVar3;
      } while (uVar15 < uVar2);
      bVar7 = true;
LAB_0010da22:
      if (uVar14 < uVar15) {
        if ((((pStream->super_TFileStream).pMaster != (TFileStream *)0x0) &&
            (pStream->pfnCallback != (STREAM_DOWNLOAD_CALLBACK)0x0)) && (bVar6 == false)) {
          (*pStream->pfnCallback)(pStream->UserData,uVar14,(int)uVar15 - (int)uVar14);
          bVar8 = true;
        }
        uVar10 = (pStream->super_TFileStream).StreamSize;
        if (uVar15 < uVar10) {
          uVar10 = uVar15;
        }
        bVar6 = (*(pStream->super_TFileStream).BlockRead)
                          (&pStream->super_TFileStream,uVar14,uVar10,local_78,(DWORD)local_70,bVar6)
        ;
        if (bVar6) goto LAB_0010dab2;
LAB_0010da9a:
        SetLastError(0x3ee);
        bVar7 = false;
        bVar6 = false;
      }
      else {
        if (!bVar7) goto LAB_0010da9a;
LAB_0010dab2:
        memcpy(pvBuffer,__ptr + uVar11,__n);
        *pUVar1 = uVar2;
        bVar7 = true;
        bVar6 = true;
      }
      if (bVar8) {
        (*pStream->pfnCallback)(pStream->UserData,0,0);
        bVar6 = bVar7;
      }
      goto LAB_0010d9f5;
    }
  }
  else {
    bVar6 = (*p_Var4)(&pStream->super_TFileStream,uVar14,uVar2,__ptr,(DWORD)local_70,true);
    if (!bVar6) {
      SetLastError(0x3ee);
      bVar6 = false;
      goto LAB_0010d9f5;
    }
  }
  memcpy(pvBuffer,__ptr + uVar11,__n);
  *pUVar1 = uVar2;
  bVar6 = true;
LAB_0010d9f5:
  free(__ptr);
  return bVar6;
}

Assistant:

static bool BlockStream_Read(
    TBlockStream * pStream,                 // Pointer to an open stream
    ULONGLONG * pByteOffset,                // Pointer to file byte offset. If NULL, it reads from the current position
    void * pvBuffer,                        // Pointer to data to be read
    DWORD dwBytesToRead)                    // Number of bytes to read from the file
{
    ULONGLONG BlockOffset0;
    ULONGLONG BlockOffset;
    ULONGLONG ByteOffset;
    ULONGLONG EndOffset;
    LPBYTE TransferBuffer;
    LPBYTE BlockBuffer;
    DWORD BlockBufferOffset;                // Offset of the desired data in the block buffer
    DWORD BytesNeeded;                      // Number of bytes that really need to be read
    DWORD BlockSize = pStream->BlockSize;
    DWORD BlockCount;
    bool bPrevBlockAvailable;
    bool bCallbackCalled = false;
    bool bBlockAvailable;
    bool bResult = true;

    // The base block read function must be present
    assert(pStream->BlockRead != NULL);

    // NOP reading of zero bytes
    if(dwBytesToRead == 0)
        return true;

    // Get the current position in the stream
    ByteOffset = (pByteOffset != NULL) ? pByteOffset[0] : pStream->StreamPos;
    EndOffset = ByteOffset + dwBytesToRead;
    if(EndOffset > pStream->StreamSize)
    {
        SetLastError(ERROR_HANDLE_EOF);
        return false;
    }

    // Calculate the block parameters
    BlockOffset0 = BlockOffset = ByteOffset & ~((ULONGLONG)BlockSize - 1);
    BlockCount  = (DWORD)(((EndOffset - BlockOffset) + (BlockSize - 1)) / BlockSize);
    BytesNeeded = (DWORD)(EndOffset - BlockOffset);

    // Remember where we have our data
    assert((BlockSize & (BlockSize - 1)) == 0);
    BlockBufferOffset = (DWORD)(ByteOffset & (BlockSize - 1));

    // Allocate buffer for reading blocks
    TransferBuffer = BlockBuffer = CASC_ALLOC(BYTE, (BlockCount * BlockSize));
    if(TransferBuffer == NULL)
    {
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        return false;
    }

    // If all blocks are available, just read all blocks at once
    if(pStream->IsComplete == 0)
    {
        // Now parse the blocks and send the block read request
        // to all blocks with the same availability
        assert(pStream->BlockCheck != NULL);
        bPrevBlockAvailable = pStream->BlockCheck(pStream, BlockOffset);

        // Loop as long as we have something to read
        while(BlockOffset < EndOffset)
        {
            // Determine availability of the next block
            bBlockAvailable = pStream->BlockCheck(pStream, BlockOffset);

            // If the availability has changed, read all blocks up to this one
            if(bBlockAvailable != bPrevBlockAvailable)
            {
                // Call the file stream callback, if the block is not available
                if(pStream->pMaster && pStream->pfnCallback && bPrevBlockAvailable == false)
                {
                    pStream->pfnCallback(pStream->UserData, BlockOffset0, (DWORD)(BlockOffset - BlockOffset0));
                    bCallbackCalled = true;
                }

                // Load the continuous blocks with the same availability
                assert(BlockOffset > BlockOffset0);
                bResult = pStream->BlockRead(pStream, BlockOffset0, BlockOffset, BlockBuffer, BytesNeeded, bPrevBlockAvailable);
                if(!bResult)
                    break;

                // Move the block offset
                BlockBuffer += (DWORD)(BlockOffset - BlockOffset0);
                BytesNeeded -= (DWORD)(BlockOffset - BlockOffset0);
                bPrevBlockAvailable = bBlockAvailable;
                BlockOffset0 = BlockOffset;
            }

            // Move to the block offset in the stream
            BlockOffset += BlockSize;
        }

        // If there is a block(s) remaining to be read, do it
        if(BlockOffset > BlockOffset0)
        {
            // Call the file stream callback, if the block is not available
            if(pStream->pMaster && pStream->pfnCallback && bPrevBlockAvailable == false)
            {
                pStream->pfnCallback(pStream->UserData, BlockOffset0, (DWORD)(BlockOffset - BlockOffset0));
                bCallbackCalled = true;
            }

            // Read the complete blocks from the file
            if(BlockOffset > pStream->StreamSize)
                BlockOffset = pStream->StreamSize;
            bResult = pStream->BlockRead(pStream, BlockOffset0, BlockOffset, BlockBuffer, BytesNeeded, bPrevBlockAvailable);
        }
    }
    else
    {
        // Read the complete blocks from the file
        if(EndOffset > pStream->StreamSize)
            EndOffset = pStream->StreamSize;
        bResult = pStream->BlockRead(pStream, BlockOffset, EndOffset, BlockBuffer, BytesNeeded, true);
    }

    // Now copy the data to the user buffer
    if(bResult)
    {
        memcpy(pvBuffer, TransferBuffer + BlockBufferOffset, dwBytesToRead);
        pStream->StreamPos = ByteOffset + dwBytesToRead;
    }
    else
    {
        // If the block read failed, set the last error
        SetLastError(ERROR_FILE_INCOMPLETE);
    }

    // Call the callback to indicate we are done
    if(bCallbackCalled)
        pStream->pfnCallback(pStream->UserData, 0, 0);

    // Free the block buffer and return
    CASC_FREE(TransferBuffer);
    return bResult;
}